

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_schema_factory.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::get_factory(validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
             string_view *schema_id,evaluation_options *options,schema_store_type *schema_store_ptr,
             vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
             *resolve_funcs,
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *vocabulary)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  undefined8 *in_RCX;
  char *in_RSI;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RDI;
  undefined1 auVar6 [16];
  unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_00000008;
  unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *factory;
  evaluation_options *in_stack_00000220;
  string_view *in_stack_00000228;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000230;
  validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000238;
  vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
  *in_stack_00000250;
  unique_ptr<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  uint uVar7;
  undefined1 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  _Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  _Var8;
  basic_string_view<char,_std::char_traits<char>_> in_stack_fffffffffffffe28;
  string local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  string local_178 [16];
  vector<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
  *in_stack_fffffffffffffe98;
  map<jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
  **in_stack_fffffffffffffea0;
  evaluation_options *in_stack_fffffffffffffea8;
  validator_factory_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *__args;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_fffffffffffffed0;
  string local_128 [32];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  string local_d8 [32];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  string local_78 [32];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_31;
  undefined8 *local_20;
  
  local_31 = 0;
  _Var8._M_head_impl = in_RDI;
  local_20 = in_RCX;
  std::
  unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
  ::
  unique_ptr<std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,void>
            ((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffe00);
  local_48 = *local_20;
  uStack_40 = local_20[1];
  schema_version::draft202012_abi_cxx11_();
  local_58 = std::__cxx11::string::operator_cast_to_basic_string_view(local_78);
  __y._M_str = in_RSI;
  __y._M_len = (size_t)_Var8._M_head_impl;
  bVar1 = std::operator==(in_stack_fffffffffffffe28,__y);
  std::__cxx11::string::~string(local_78);
  if ((bVar1 & 1) == 0) {
    local_a8 = *local_20;
    uStack_a0 = local_20[1];
    schema_version::draft201909_abi_cxx11_();
    local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_d8);
    __y_00._M_str = in_RSI;
    __y_00._M_len = (size_t)_Var8._M_head_impl;
    bVar2 = std::operator==(in_stack_fffffffffffffe28,__y_00);
    std::__cxx11::string::~string(local_d8);
    if ((bVar2 & 1) == 0) {
      local_f8 = *local_20;
      uStack_f0 = local_20[1];
      schema_version::draft7_abi_cxx11_();
      local_108 = std::__cxx11::string::operator_cast_to_basic_string_view(local_128);
      __y_01._M_str = in_RSI;
      __y_01._M_len = (size_t)_Var8._M_head_impl;
      bVar3 = std::operator==(in_stack_fffffffffffffe28,__y_01);
      std::__cxx11::string::~string(local_128);
      if ((bVar3 & 1) == 0) {
        __args = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)*local_20;
        schema_version::draft6_abi_cxx11_();
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view(local_178);
        __y_02._M_str = in_RSI;
        __y_02._M_len = (size_t)_Var8._M_head_impl;
        bVar4 = std::operator==(in_stack_fffffffffffffe28,__y_02);
        std::__cxx11::string::~string(local_178);
        if ((bVar4 & 1) == 0) {
          local_198 = *local_20;
          uStack_190 = local_20[1];
          schema_version::draft4_abi_cxx11_();
          local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1c8);
          __y_03._M_str = in_RSI;
          __y_03._M_len = (size_t)_Var8._M_head_impl;
          bVar5 = std::operator==(in_stack_fffffffffffffe28,__y_03);
          uVar7 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffe08);
          std::__cxx11::string::~string(local_1c8);
          if ((uVar7 & 0x1000000) == 0) {
            get_factory_from_meta_schema
                      (in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000220,
                       (schema_store_type *)vocabulary,in_stack_00000250);
            std::
            unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffe00,in_stack_00000008);
            std::
            unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::~unique_ptr((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffe00);
          }
          else {
            std::
            make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                      (__args,auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffea0,
                       in_stack_fffffffffffffe98);
            std::
            unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_RDI,
                        (unique_ptr<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,uVar7)))));
            std::
            unique_ptr<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::~unique_ptr((unique_ptr<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft4::schema_validator_factory_4<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffe00);
          }
        }
        else {
          std::
          make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                    (__args,auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98);
          std::
          unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_RDI,
                      (unique_ptr<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(bVar4,
                                                  in_stack_fffffffffffffe08)))));
          std::
          unique_ptr<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::~unique_ptr((unique_ptr<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft6::schema_validator_factory_6<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffe00);
        }
      }
      else {
        std::
        make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&>
                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::
        unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)in_RDI,
                    (unique_ptr<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                     *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffffe0c,
                                                  in_stack_fffffffffffffe08)))));
        std::
        unique_ptr<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::~unique_ptr((unique_ptr<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft7::schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe00);
      }
    }
    else {
      std::
      make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
      std::
      unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_RDI,
                  (unique_ptr<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(in_stack_fffffffffffffe0d,
                                                            CONCAT14(in_stack_fffffffffffffe0c,
                                                                     in_stack_fffffffffffffe08)))));
      std::
      unique_ptr<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~unique_ptr(in_stack_fffffffffffffe00);
    }
  }
  else {
    std::
    make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::jsonschema::validator_factory_factory<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&,jsoncons::jsonschema::evaluation_options_const&,std::map<jsoncons::uri,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>*&,std::vector<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>,std::allocator<std::function<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>>>const&,std::unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>const&>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
    std::
    unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::operator=((unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)in_RDI,
                (unique_ptr<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe0e,
                                           CONCAT15(in_stack_fffffffffffffe0d,
                                                    CONCAT14(in_stack_fffffffffffffe0c,
                                                             in_stack_fffffffffffffe08)))));
    std::
    unique_ptr<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~unique_ptr((unique_ptr<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe00);
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )_Var8._M_head_impl;
}

Assistant:

std::unique_ptr<schema_validator_factory_base<Json>> get_factory(Json&& sch, const jsoncons::string_view& schema_id,
            const evaluation_options& options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs,
            const std::unordered_map<std::string,bool>& vocabulary) const
        {
            std::unique_ptr<schema_validator_factory_base<Json>> factory;

            if (schema_id == schema_version::draft202012())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft202012::schema_validator_factory_202012<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft201909())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft201909::schema_validator_factory_201909<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs, vocabulary);
            }
            else if (schema_id == schema_version::draft7())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft7::schema_validator_factory_7<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft6())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft6::schema_validator_factory_6<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else if (schema_id == schema_version::draft4())
            {
                factory = jsoncons::make_unique<jsoncons::jsonschema::draft4::schema_validator_factory_4<Json>>(std::move(sch), *this, 
                    options, schema_store_ptr, resolve_funcs);
            }
            else
            { 
                factory = get_factory_from_meta_schema(std::move(sch), schema_id, options, schema_store_ptr, resolve_funcs);
            }
            return factory;
        }